

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86formatter.cpp
# Opt level: O0

Error asmjit::v1_14::x86::FormatterInternal_formatImmText
                (String *sb,uint32_t imm8,uint32_t bits,uint32_t advance,char *text,uint32_t count)

{
  uint uVar1;
  uint uVar2;
  Error EVar3;
  int in_ECX;
  byte in_DL;
  uint in_ESI;
  String *in_RDI;
  char *in_R8;
  uint in_R9D;
  Error _err_1;
  Error _err;
  uint32_t value;
  uint32_t i;
  uint32_t pos;
  uint32_t mask;
  char c;
  String *in_stack_ffffffffffffff60;
  ModifyOp op;
  String *in_stack_ffffffffffffff68;
  undefined2 in_stack_ffffffffffffff70;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffff74;
  uint local_80;
  ModifyOp op_00;
  uint local_5c;
  uint local_10;
  char *local_8;
  
  uVar1 = (1 << (in_DL & 0x1f)) - 1;
  op_00 = kAssign;
  local_80 = 0;
  local_5c = in_ESI;
  while( true ) {
    c = (char)((ulong)in_stack_ffffffffffffff60 >> 0x18);
    op = (ModifyOp)((ulong)in_stack_ffffffffffffff60 >> 0x20);
    if (in_R9D <= local_80) {
      EVar3 = String::_opChar(in_stack_ffffffffffffff68,op,c);
      return EVar3;
    }
    uVar2 = (local_5c & uVar1) + op_00;
    uVar4 = 0x7c;
    uVar5 = 0x7b;
    if (local_80 != 0) {
      uVar5 = 0x7c;
    }
    in_stack_ffffffffffffff68 = in_RDI;
    EVar3 = String::_opChar(in_RDI,op,c);
    if (EVar3 != 0) break;
    local_8 = in_R8;
    for (local_10 = 0; local_10 < uVar2; local_10 = local_10 + 1) {
      for (; *local_8 != '\0'; local_8 = local_8 + 1) {
      }
      local_8 = local_8 + 1;
    }
    EVar3 = String::_opString((String *)CONCAT44(in_R9D,uVar1),op_00,(char *)((ulong)uVar2 << 0x20),
                              CONCAT44(in_stack_ffffffffffffff74,
                                       CONCAT13(uVar5,CONCAT12(uVar4,in_stack_ffffffffffffff70))));
    if (EVar3 != 0) {
      return EVar3;
    }
    local_80 = local_80 + 1;
    local_5c = local_5c >> (in_DL & 0x1f);
    op_00 = in_ECX + op_00;
    in_stack_ffffffffffffff74 = 0;
    in_stack_ffffffffffffff60 = in_RDI;
  }
  return EVar3;
}

Assistant:

ASMJIT_FAVOR_SIZE static Error FormatterInternal_formatImmText(String& sb, uint32_t imm8, uint32_t bits, uint32_t advance, const char* text, uint32_t count = 1) noexcept {
  uint32_t mask = (1u << bits) - 1;
  uint32_t pos = 0;

  for (uint32_t i = 0; i < count; i++, imm8 >>= bits, pos += advance) {
    uint32_t value = (imm8 & mask) + pos;
    ASMJIT_PROPAGATE(sb.append(i == 0 ? kImmCharStart : kImmCharOr));
    ASMJIT_PROPAGATE(sb.append(Support::findPackedString(text, value)));
  }

  return sb.append(kImmCharEnd);
}